

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O0

void __thiscall
swrenderer::FWallTmapVals::InitFromLine(FWallTmapVals *this,DVector2 *left,DVector2 *right)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double fully2;
  double fully1;
  double fullx2;
  double fullx1;
  DVector2 *right_local;
  DVector2 *left_local;
  FWallTmapVals *this_local;
  
  fullx2 = left->X * ViewSin - left->Y * ViewCos;
  fully1 = right->X * ViewSin - right->Y * ViewCos;
  dVar1 = left->X * ViewTanCos + left->Y * ViewTanSin;
  dVar2 = right->X * ViewTanCos;
  dVar3 = right->Y * ViewTanSin;
  if ((MirrorFlags & 1) != 0) {
    fullx2 = -fullx2;
    fully1 = -fully1;
  }
  this->UoverZorg = (float)(fullx2 * (double)centerx);
  this->UoverZstep = (float)-dVar1;
  this->InvZorg = (float)((fullx2 - fully1) * (double)centerx);
  this->InvZstep = (float)((dVar2 + dVar3) - dVar1);
  return;
}

Assistant:

void FWallTmapVals::InitFromLine(const DVector2 &left, const DVector2 &right)
{ // Coordinates should have already had viewx,viewy subtracted
	double fullx1 = left.X * ViewSin - left.Y * ViewCos;
	double fullx2 = right.X * ViewSin - right.Y * ViewCos;
	double fully1 = left.X * ViewTanCos + left.Y * ViewTanSin;
	double fully2 = right.X * ViewTanCos + right.Y * ViewTanSin;

	if (MirrorFlags & RF_XFLIP)
	{
		fullx1 = -fullx1;
		fullx2 = -fullx2;
	}

	UoverZorg = float(fullx1 * centerx);
	UoverZstep = float(-fully1);
	InvZorg = float((fullx1 - fullx2) * centerx);
	InvZstep = float(fully2 - fully1);
}